

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3SegReaderFree(Fts3SegReader *pReader)

{
  long in_RDI;
  sqlite3_blob *in_stack_00000010;
  
  if (in_RDI != 0) {
    sqlite3_free((void *)0x23f909);
    if (*(char *)(in_RDI + 5) == '\0') {
      sqlite3_free((void *)0x23f923);
    }
    sqlite3_blob_close(in_stack_00000010);
  }
  sqlite3_free((void *)0x23f939);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3SegReaderFree(Fts3SegReader *pReader){
  if( pReader ){
    sqlite3_free(pReader->zTerm);
    if( !fts3SegReaderIsRootOnly(pReader) ){
      sqlite3_free(pReader->aNode);
    }
    sqlite3_blob_close(pReader->pBlob);
  }
  sqlite3_free(pReader);
}